

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_aea87::TraverseInfo::TraverseInfo(TraverseInfo *this,Ref node)

{
  Type TVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  Value *local_28;
  Ref node_local;
  
  (this->node).inst = node.inst;
  this->scanned = false;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<cashew::Ref,_std::allocator<cashew::Ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = node.inst;
  if (node.inst != (Value *)0x0) {
    TVar1 = (node.inst)->type;
    if (TVar1 == AssignName_) {
      lVar4 = cashew::Value::asAssignName();
      maybeAdd(this,*(Value **)(lVar4 + 8));
    }
    else if (TVar1 == Assign_) {
      lVar4 = cashew::Value::asAssign();
      maybeAdd(this,*(Value **)(lVar4 + 8));
      maybeAdd(this,*(Value **)(lVar4 + 0x18));
    }
    else if (TVar1 == Array) {
      uVar5 = 0;
      while( true ) {
        sVar2 = cashew::Value::size(local_28);
        if (sVar2 <= uVar5) break;
        puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
        maybeAdd(this,(Value *)*puVar3);
        uVar5 = uVar5 + 1;
      }
    }
    return;
  }
  __assert_fail("node.get()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm2js.cpp"
                ,0x4c,"(anonymous namespace)::TraverseInfo::TraverseInfo(Ref)");
}

Assistant:

TraverseInfo(Ref node) : node(node) {
    assert(node.get());
    if (node->isArray()) {
      for (size_t i = 0; i < node->size(); i++) {
        maybeAdd(node[i]);
      }
    } else if (node->isAssign()) {
      auto assign = node->asAssign();
      maybeAdd(assign->target());
      maybeAdd(assign->value());
    } else if (node->isAssignName()) {
      auto assign = node->asAssignName();
      maybeAdd(assign->value());
    } else {
      // no children
    }
  }